

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

RepeatedField<float> * __thiscall
google::protobuf::Reflection::GetRaw<google::protobuf::RepeatedField<float>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  char *pcVar1;
  bool bVar2;
  uint32_t uVar3;
  OneofDescriptor *pOVar4;
  RepeatedField<float> *pRVar5;
  LogMessage *this_00;
  string_view v;
  LogMessage LStack_28;
  
  VerifyFieldType<google::protobuf::RepeatedField<float>>(this,field);
  pOVar4 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar4 != (OneofDescriptor *)0x0) {
    bVar2 = HasOneofField(this,message,field);
    if (!bVar2) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
                 ,0x704,"!schema_.InRealOneof(field) || HasOneofField(message, field)");
      this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (&LStack_28,(char (*) [9])"Field = ");
      pcVar1 = (field->all_names_).payload_;
      v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
      v._M_str = pcVar1 + ~v._M_len;
      absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_28);
    }
  }
  pOVar4 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar4 == (OneofDescriptor *)0x0) {
    pRVar5 = GetRawNonOneof<google::protobuf::RepeatedField<float>>(this,message,field);
    return pRVar5;
  }
  bVar2 = internal::ReflectionSchema::IsSplit(&this->schema_,field);
  if (!bVar2) {
    uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    return (RepeatedField<float> *)
           ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
             ,0x70c,"!schema_.IsSplit(field)");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_28)
  ;
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  VerifyFieldType<Type>(field);
  ABSL_DCHECK(!schema_.InRealOneof(field) || HasOneofField(message, field))
      << "Field = " << field->full_name();

  if (ABSL_PREDICT_TRUE(!schema_.InRealOneof(field))) {
    return GetRawNonOneof<Type>(message, field);
  }

  // Oneof fields are not split.
  ABSL_DCHECK(!schema_.IsSplit(field));

  const uint32_t field_offset = schema_.GetFieldOffset(field);
  return internal::GetConstRefAtOffset<Type>(message, field_offset);
}